

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_check_uses(lys_module *module,lys_node_uses *uses,int options,unres_schema *unres)

{
  byte bVar1;
  int iVar2;
  uint local_34;
  uint size;
  uint i;
  unres_schema *unres_local;
  int options_local;
  lys_node_uses *uses_local;
  lys_module *module_local;
  
  bVar1 = uses->augment_size;
  uses->augment_size = '\0';
  iVar2 = yang_check_iffeatures(module,(void *)0x0,uses,USES_KEYWORD,unres);
  if (iVar2 == 0) {
    for (local_34 = 0; local_34 < uses->refine_size; local_34 = local_34 + 1) {
      iVar2 = yang_check_iffeatures(module,uses->refine + local_34,uses,REFINE_KEYWORD,unres);
      if (((iVar2 != 0) ||
          (iVar2 = yang_check_must(module,uses->refine[local_34].must,
                                   (uint)uses->refine[local_34].must_size,unres), iVar2 != 0)) ||
         (iVar2 = yang_check_ext_instance
                            (module,&uses->refine[local_34].ext,
                             (uint)uses->refine[local_34].ext_size,uses->refine + local_34,unres),
         iVar2 != 0)) goto LAB_00187724;
    }
    for (local_34 = 0; local_34 < bVar1; local_34 = local_34 + 1) {
      uses->augment_size = uses->augment_size + '\x01';
      iVar2 = yang_check_augment(module,uses->augment + local_34,options,unres);
      if (iVar2 != 0) goto LAB_00187724;
    }
    iVar2 = unres_schema_add_node(module,unres,uses,UNRES_USES,(lys_node *)0x0);
    if ((iVar2 != -1) &&
       ((uses->when == (lys_when *)0x0 ||
        (iVar2 = yang_check_ext_instance
                           (module,&uses->when->ext,(uint)uses->when->ext_size,uses->when,unres),
        iVar2 == 0)))) {
      if ((((module->ctx->models).flags & 2U) != 0) || (uses->when == (lys_when *)0x0)) {
        return 0;
      }
      if ((options & 4U) == 0) {
        iVar2 = unres_schema_add_node(module,unres,uses,UNRES_XPATH,(lys_node *)0x0);
        if (iVar2 != -1) {
          return 0;
        }
      }
      else {
        iVar2 = lyxp_node_check_syntax((lys_node *)uses);
        if (iVar2 == 0) {
          return 0;
        }
      }
    }
  }
LAB_00187724:
  for (local_34 = (uint)uses->augment_size; local_34 < bVar1; local_34 = local_34 + 1) {
    yang_free_augment(module->ctx,uses->augment + local_34);
  }
  return 1;
}

Assistant:

static int
yang_check_uses(struct lys_module *module, struct lys_node_uses *uses, int options, struct unres_schema *unres)
{
    uint i, size;

    size = uses->augment_size;
    uses->augment_size = 0;

    if (yang_check_iffeatures(module, NULL, uses, USES_KEYWORD, unres)) {
        goto error;
    }

    for (i = 0; i < uses->refine_size; ++i) {
        if (yang_check_iffeatures(module, &uses->refine[i], uses, REFINE_KEYWORD, unres)) {
            goto error;
        }
        if (yang_check_must(module, uses->refine[i].must, uses->refine[i].must_size, unres)) {
            goto error;
        }
        if (yang_check_ext_instance(module, &uses->refine[i].ext, uses->refine[i].ext_size, &uses->refine[i], unres)) {
            goto error;
        }
    }

    for (i = 0; i < size; ++i) {
        uses->augment_size++;
        if (yang_check_augment(module, &uses->augment[i], options, unres)) {
            goto error;
        }
    }

    if (unres_schema_add_node(module, unres, uses, UNRES_USES, NULL) == -1) {
        goto error;
    }

    if (uses->when && yang_check_ext_instance(module, &uses->when->ext, uses->when->ext_size, uses->when, unres)) {
        goto error;
    }

    /* check XPath dependencies */
    if (!(module->ctx->models.flags & LY_CTX_TRUSTED) && uses->when) {
        if (options & LYS_PARSE_OPT_INGRP) {
            if (lyxp_node_check_syntax((struct lys_node *)uses)) {
                goto error;
            }
        } else {
            if (unres_schema_add_node(module, unres, uses, UNRES_XPATH, NULL) == -1) {
                goto error;
            }
        }
    }

    return EXIT_SUCCESS;

error:
    for (i = uses->augment_size; i < size; ++i) {
        yang_free_augment(module->ctx, &uses->augment[i]);
    }
    return EXIT_FAILURE;
}